

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.h
# Opt level: O0

BasicStatus __thiscall ipx::Basis::StatusOf(Basis *this,Int j)

{
  int iVar1;
  Int IVar2;
  const_reference pvVar3;
  int in_ESI;
  long in_RDI;
  Int p;
  Int m;
  BasicStatus local_4;
  
  IVar2 = Model::rows(*(Model **)(in_RDI + 8));
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)in_ESI);
  iVar1 = *pvVar3;
  if (iVar1 < 0) {
    local_4 = NONBASIC_FIXED;
    if (iVar1 == -1) {
      local_4 = NONBASIC;
    }
  }
  else {
    local_4 = (BasicStatus)(IVar2 <= iVar1);
  }
  return local_4;
}

Assistant:

inline Basis::BasicStatus Basis::StatusOf(Int j) const {
    const Int m = model_.rows();
    const Int p = map2basis_[j];
    assert(p >= -2 && p < 2*m);
    if (p < 0)
        return p == -1 ? NONBASIC : NONBASIC_FIXED;
    else
        return p < m ? BASIC : BASIC_FREE;
}